

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O1

DUH * make_duh(int32 length,int n_tags,char *(*tags) [2],int n_signals,DUH_SIGTYPE_DESC **desc,
              sigdata_t **sigdata)

{
  char *pcVar1;
  bool bVar2;
  DUH *duh;
  DUH_SIGNAL **ppDVar3;
  DUH_SIGNAL *pDVar4;
  size_t sVar5;
  size_t sVar6;
  char *(*__ptr) [2];
  char *__dest;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  duh = (DUH *)malloc(0x20);
  if (duh == (DUH *)0x0) {
LAB_005bc3e9:
    duh = (DUH *)0x0;
  }
  else {
    duh->n_signals = n_signals;
    ppDVar3 = (DUH_SIGNAL **)malloc((long)n_signals << 3);
    duh->signal = ppDVar3;
    if (ppDVar3 == (DUH_SIGNAL **)0x0) {
      free(duh);
      goto LAB_005bc3e9;
    }
  }
  if (duh == (DUH *)0x0) {
    if (0 < n_signals) {
      uVar8 = 0;
      do {
        if ((desc[uVar8]->unload_sigdata != (DUH_UNLOAD_SIGDATA)0x0) &&
           (sigdata[uVar8] != (sigdata_t *)0x0)) {
          (*desc[uVar8]->unload_sigdata)(sigdata[uVar8]);
        }
        uVar8 = uVar8 + 1;
      } while ((uint)n_signals != uVar8);
      return (DUH *)0x0;
    }
LAB_005bc586:
    duh = (DUH *)0x0;
  }
  else {
    duh->n_tags = 0;
    duh->tag = (char *(*) [2])0x0;
    if (0 < n_signals) {
      uVar8 = 0;
      bVar2 = false;
      do {
        pDVar4 = make_signal(desc[uVar8],sigdata[uVar8]);
        duh->signal[uVar8] = pDVar4;
        if (duh->signal[uVar8] == (DUH_SIGNAL *)0x0) {
          bVar2 = true;
        }
        uVar8 = uVar8 + 1;
      } while ((uint)n_signals != uVar8);
      if (bVar2) {
        unload_duh(duh);
        goto LAB_005bc586;
      }
    }
    duh->length = length;
    uVar7 = n_tags * 2;
    if (0 < n_tags) {
      lVar9 = 0;
      do {
        sVar5 = strlen(*(char **)((long)*tags + lVar9));
        sVar6 = strlen(*(char **)((long)*tags + lVar9 + 8));
        uVar7 = uVar7 + (int)sVar6 + (int)sVar5;
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(uint)n_tags << 4 != lVar9);
    }
    if (0 < (int)uVar7) {
      __ptr = (char *(*) [2])malloc((long)n_tags << 4);
      duh->tag = __ptr;
      if (__ptr != (char *(*) [2])0x0) {
        __dest = (char *)malloc((ulong)uVar7);
        (*__ptr)[0] = __dest;
        if (__dest == (char *)0x0) {
          free(__ptr);
          duh->tag = (char *(*) [2])0x0;
        }
        else {
          duh->n_tags = n_tags;
          if (0 < n_tags) {
            lVar9 = 0;
            do {
              *(char **)((long)*duh->tag + lVar9) = __dest;
              pcVar1 = *(char **)((long)*tags + lVar9);
              strcpy(__dest,pcVar1);
              sVar5 = strlen(pcVar1);
              *(char **)((long)*duh->tag + lVar9 + 8) = __dest + sVar5 + 1;
              pcVar1 = *(char **)((long)*tags + lVar9 + 8);
              strcpy(__dest + sVar5 + 1,pcVar1);
              sVar6 = strlen(pcVar1);
              __dest = __dest + sVar6 + sVar5 + 2;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)(uint)n_tags << 4 != lVar9);
          }
        }
      }
    }
  }
  return duh;
}

Assistant:

DUH *make_duh(
	int32 length,
	int n_tags,
	const char *const tags[][2],
	int n_signals,
	DUH_SIGTYPE_DESC *desc[],
	sigdata_t *sigdata[]
)
{
	DUH *duh = malloc(sizeof(*duh));
	int i;
	int fail;

	if (duh) {
		duh->n_signals = n_signals;

		duh->signal = malloc(n_signals * sizeof(*duh->signal));

		if (!duh->signal) {
			free(duh);
			duh = NULL;
		}
	}

	if (!duh) {
		for (i = 0; i < n_signals; i++)
			if (desc[i]->unload_sigdata)
				if (sigdata[i])
					(*desc[i]->unload_sigdata)(sigdata[i]);
		return NULL;
	}

	duh->n_tags = 0;
	duh->tag = NULL;

	fail = 0;

	for (i = 0; i < n_signals; i++) {
		duh->signal[i] = make_signal(desc[i], sigdata[i]);
		if (!duh->signal[i])
			fail = 1;
	}

	if (fail) {
		unload_duh(duh);
		return NULL;
	}

	duh->length = length;

	{
		int mem = n_tags * 2; /* account for NUL terminators here */
		char *ptr;

		for (i = 0; i < n_tags; i++)
			mem += (int)(strlen(tags[i][0]) + strlen(tags[i][1]));

		if (mem <= 0) return duh;

		duh->tag = malloc(n_tags * sizeof(*duh->tag));
		if (!duh->tag) return duh;
		duh->tag[0][0] = malloc(mem);
		if (!duh->tag[0][0]) {
			free(duh->tag);
			duh->tag = NULL;
			return duh;
		}
		duh->n_tags = n_tags;
		ptr = duh->tag[0][0];
		for (i = 0; i < n_tags; i++) {
			duh->tag[i][0] = ptr;
			strcpy(ptr, tags[i][0]);
			ptr += strlen(tags[i][0]) + 1;
			duh->tag[i][1] = ptr;
			strcpy(ptr, tags[i][1]);
			ptr += strlen(tags[i][1]) + 1;
		}
	}

	return duh;
}